

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cpp
# Opt level: O3

void InitEval1(void)

{
  long lVar1;
  bool bVar2;
  int u_1;
  array<int,_3UL> *paVar3;
  double (*padVar4) [3];
  int u;
  long lVar5;
  int i_1;
  int v;
  int iVar6;
  long lVar7;
  bool bVar8;
  short i;
  long lVar9;
  double dVar10;
  double dVar11;
  TBoard board;
  array<int,_3UL> local_4c;
  int aiStack_40 [6];
  
  lVar9 = 0;
  do {
    makeBoard((TBoard *)&local_4c,(short)lVar9);
    dVar10 = 0.0;
    if (g_board_status[lVar9] == '\0') {
      padVar4 = g_eval_micro_matrix1;
      lVar5 = 0;
      paVar3 = &local_4c;
      do {
        lVar7 = 0;
        do {
          iVar6 = ((array<int,_3UL> *)paVar3->_M_elems)->_M_elems[lVar7];
          if (iVar6 != 0) {
            dVar10 = dVar10 + (double)(iVar6 * -2 + 3) * (*padVar4)[lVar7];
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
        lVar5 = lVar5 + 1;
        padVar4 = padVar4 + 1;
        paVar3 = paVar3 + 1;
      } while (lVar5 != 3);
      lVar5 = 0;
      do {
        lVar7 = 0;
        iVar6 = (&local_4c)[lVar5]._M_elems[0];
        bVar2 = true;
        do {
          bVar8 = bVar2;
          lVar1 = lVar7 + 1;
          if (iVar6 != 0 && iVar6 == (&local_4c)[lVar5]._M_elems[lVar1]) {
            dVar11 = (double)(iVar6 * -2 + 3);
            dVar10 = dVar10 + dVar11 + dVar11;
          }
          iVar6 = (&local_4c)[lVar7]._M_elems[lVar5];
          if ((iVar6 != 0) && (iVar6 == (&local_4c)[lVar7 + 1]._M_elems[lVar5])) {
            dVar11 = (double)(iVar6 * -2 + 3);
            dVar10 = dVar10 + dVar11 + dVar11;
          }
          lVar7 = 1;
          iVar6 = (&local_4c)[lVar5]._M_elems[lVar1];
          bVar2 = false;
        } while (bVar8);
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      if (aiStack_40[1] != 0) {
        if ((aiStack_40[1] == local_4c._M_elems[0]) || (aiStack_40[1] == aiStack_40[5])) {
          dVar11 = (double)(aiStack_40[1] * -2 + 3);
          dVar10 = dVar10 + dVar11 + dVar11;
        }
        if ((aiStack_40[1] == aiStack_40[3]) || (aiStack_40[1] == local_4c._M_elems[2])) {
          dVar11 = (double)(aiStack_40[1] * -2 + 3);
          dVar10 = dVar10 + dVar11 + dVar11;
        }
      }
    }
    g_eval_micro1[lVar9] = dVar10;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x4ce3);
  lVar9 = 0;
  do {
    makeBoard4((TBoard *)&local_4c,(int)lVar9);
    dVar10 = 0.0;
    padVar4 = g_eval_macro_matrix1;
    lVar5 = 0;
    paVar3 = &local_4c;
    do {
      lVar7 = 0;
      do {
        iVar6 = ((array<int,_3UL> *)paVar3->_M_elems)->_M_elems[lVar7];
        if (iVar6 - 1U < 2) {
          dVar10 = dVar10 + (double)(iVar6 * -2 + 3) * (*padVar4)[lVar7];
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      lVar5 = lVar5 + 1;
      padVar4 = padVar4 + 1;
      paVar3 = paVar3 + 1;
    } while (lVar5 != 3);
    lVar5 = 0;
    do {
      lVar7 = 0;
      iVar6 = (&local_4c)[lVar5]._M_elems[0];
      bVar2 = true;
      do {
        bVar8 = bVar2;
        lVar1 = lVar7 + 1;
        if (iVar6 != 0 && iVar6 == (&local_4c)[lVar5]._M_elems[lVar1]) {
          dVar10 = dVar10 + (double)(iVar6 * -2 + 3) * 15.0;
        }
        iVar6 = (&local_4c)[lVar7]._M_elems[lVar5];
        if ((iVar6 != 0) && (iVar6 == (&local_4c)[lVar7 + 1]._M_elems[lVar5])) {
          dVar10 = dVar10 + (double)(iVar6 * -2 + 3) * 15.0;
        }
        lVar7 = 1;
        iVar6 = (&local_4c)[lVar5]._M_elems[lVar1];
        bVar2 = false;
      } while (bVar8);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    if (aiStack_40[1] - 1U < 2) {
      if ((aiStack_40[1] == local_4c._M_elems[0]) || (aiStack_40[1] == aiStack_40[5])) {
        dVar10 = dVar10 + (double)(aiStack_40[1] * -2 + 3) * 15.0;
      }
      if ((aiStack_40[1] == aiStack_40[3]) || (aiStack_40[1] == local_4c._M_elems[2])) {
        dVar10 = dVar10 + (double)(aiStack_40[1] * -2 + 3) * 15.0;
      }
    }
    g_eval_macro1[lVar9] = dVar10;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x40000);
  return;
}

Assistant:

void
InitEval1()
{
    for (short i = 0; i < 19683; i++)
    {
        double points = 0.0;
        auto board = makeBoard(i);
        if (g_board_status[i] == 0)
        {
            for (int u = 0; u < 3; ++u)
                for (int v = 0; v < 3; ++v)
                    if (board[u][v] != 0)
                        points += (-2 * board[u][v] + 3) * g_eval_micro_matrix1[u][v];
            for (int u = 0; u < 3; ++u)
                for (int v = 0; v < 2; ++v)
                {
                    if (board[u][v] == board[u][v + 1] && board[u][v] != 0)
                        points += (-2 * board[u][v] + 3) * g_micro_double_bonus1;
                    if (board[v][u] == board[v + 1][u] && board[v][u] != 0)
                        points += (-2 * board[v][u] + 3) * g_micro_double_bonus1;
                }
            if (board[1][1] != 0)
            {
                if (board[1][1] == board[0][0] || board[1][1] == board[2][2])
                    points += (-2 * board[1][1] + 3) * g_micro_double_bonus1;
                if (board[1][1] == board[2][0] || board[1][1] == board[0][2])
                    points += (-2 * board[1][1] + 3) * g_micro_double_bonus1;
            }
        }
        g_eval_micro1[i] = points;
    }

    for (int i = 0; i < 262144; i++)
    {
        double points = 0.0;
        auto board = makeBoard4(i);
        for (int u = 0; u < 3; ++u)
            for (int v = 0; v < 3; ++v)
                if (board[u][v] == 1 || board[u][v] == 2)
                    points += (-2 * board[u][v] + 3) * g_eval_macro_matrix1[u][v];
        for (int u = 0; u < 3; ++u)
            for (int v = 0; v < 2; ++v)
            {
                if (board[u][v] == board[u][v + 1] && board[u][v] != 0)
                    points += (-2 * board[u][v] + 3) * g_macro_double_bonus1;
                if (board[v][u] == board[v + 1][u] && board[v][u] != 0)
                    points += (-2 * board[v][u] + 3) * g_macro_double_bonus1;
            }
        if (board[1][1] == 1 || board[1][1] == 2)
        {
            if (board[1][1] == board[0][0] || board[1][1] == board[2][2])
                points += (-2 * board[1][1] + 3) * g_macro_double_bonus1;
            if (board[1][1] == board[2][0] || board[1][1] == board[0][2])
                points += (-2 * board[1][1] + 3) * g_macro_double_bonus1;
        }
        g_eval_macro1[i] = points;
    }
}